

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cpp
# Opt level: O0

void * __thiscall Cache::malloc(Cache *this,size_t __size)

{
  SpanList *this_00;
  void *pvVar1;
  Span *local_38;
  Span *p;
  Span *span;
  SpanList *spanList;
  int local_18;
  int i;
  int spanClass;
  int size_local;
  Cache *this_local;
  
  local_18 = 1;
  for (spanList._4_4_ = 1; spanList._4_4_ < 0x43; spanList._4_4_ = spanList._4_4_ + 1) {
    if ((int)__size <= spanInfo[spanList._4_4_][1]) {
      local_18 = spanInfo[spanList._4_4_][0];
      break;
    }
  }
  this_00 = this->alloc + local_18;
  p = (Span *)0x0;
  if (this_00->list == (Span *)0x0) {
    std::mutex::lock(&this->mtx);
    __size = (size_t)Central::malloc((Central *)(&this->field_0x430 + (long)local_18 * 0x28),
                                     (size_t)this->spanMap);
    SpanList::pushBack(this_00,(Span *)__size);
    p = this_00->list;
    std::mutex::unlock(&this->mtx);
  }
  else {
    local_38 = this_00->list;
    do {
      if (local_38->allocCount < local_38->nelems) {
        p = local_38;
        break;
      }
      local_38 = local_38->next;
    } while (local_38 != this_00->list);
    if (p == (Span *)0x0) {
      std::mutex::lock(&this->mtx);
      __size = (size_t)Central::malloc((Central *)(&this->field_0x430 + (long)local_18 * 0x28),
                                       (size_t)this->spanMap);
      SpanList::pushFront(this_00,(Span *)__size);
      p = this_00->list;
      std::mutex::unlock(&this->mtx);
    }
  }
  pvVar1 = Span::malloc(p,__size);
  return pvVar1;
}

Assistant:

void *Cache::malloc(int size) {
    // 根据size, 选择一个合适的class
    int spanClass = 1;
    for (int i = 1; i < spanClasses; i++) {
        if (size <= spanInfo[i][1]) {
            spanClass = spanInfo[i][0];
            break;
        }
    }
    SpanList* spanList = &(this->alloc[spanClass]);  // 要用指针!
    /*
     * 三种情况
     * 1. 列表中没有一个span, 即 span == nullptr
     * 2. 列表中有span, 但是都没有了空间
     * 3. 列表中有span, 并且存在空间, 可以分配
     *
     * 情况 1, 2 都需要向central中请求空间
     */
    Span* span = nullptr;
    if (spanList->list == nullptr) {  // 情况 1
        // 锁
        mtx.lock();
        spanList->pushBack(ctl[spanClass].malloc(spanMap));  // central.malloc 会返回一个 span指针
        span = spanList->list;
        // 解锁
        mtx.unlock();
    } else {
        auto p = spanList->list;
        do {
            if (p->allocCount < p->nelems) {  // 有可分配的
                span = p;  // 第三种情况
                break;
            }
            p = p->next;
        } while (p != spanList->list);
        if (span == nullptr) {  // 第二种情况
            // 锁
            mtx.lock();
            spanList->pushFront(ctl[spanClass].malloc(spanMap));
            span = spanList->list;
            // 解锁
            mtx.unlock();
        }
    }
    return span->malloc();
}